

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O0

MPP_RET hal_jpege_vepu1_init(void *hal,MppEncHalCfg *cfg)

{
  void *pvVar1;
  HalJpegeCtx *ctx;
  MPP_RET ret;
  MppEncHalCfg *cfg_local;
  void *hal_local;
  
  mpp_env_get_u32("hal_jpege_debug",&hal_jpege_debug,0);
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","enter hal %p cfg %p\n","hal_jpege_vepu1_init",hal,cfg);
  }
  cfg->type = VPU_CLIENT_VEPU1;
  hal_local._4_4_ = mpp_dev_init(&cfg->dev,cfg->type);
  if (hal_local._4_4_ == MPP_OK) {
    *(MppDev *)hal = cfg->dev;
    jpege_bits_init((JpegeBits *)((long)hal + 0x10));
    if ((*(long *)((long)hal + 0x10) == 0) &&
       (_mpp_log_l(2,"hal_jpege_vepu1","Assertion %s failed at %s:%d\n",(char *)0x0,"ctx->bits",
                   "hal_jpege_vepu1_init",0x39), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    hal_local._4_4_ = hal_jpege_vepu_init_rc((HalJpegeRc *)((long)hal + 0x130));
    if (hal_local._4_4_ == MPP_OK) {
      *(MppEncCfgSet **)((long)hal + 0x38) = cfg->cfg;
      *(undefined4 *)((long)hal + 0x28) = 0x290;
      pvVar1 = mpp_osal_calloc("hal_jpege_vepu1_init",(ulong)*(uint *)((long)hal + 0x28) + 0x88);
      *(void **)((long)hal + 0x18) = pvVar1;
      if (*(long *)((long)hal + 0x18) == 0) {
        _mpp_log_l(2,"hal_jpege_vepu1","failed to malloc vepu1 regs\n","hal_jpege_vepu1_init");
        hal_local._4_4_ = MPP_NOK;
      }
      else {
        pvVar1 = mpp_osal_calloc("hal_jpege_vepu1_init",(ulong)*(uint *)((long)hal + 0x28) + 0x88);
        *(void **)((long)hal + 0x20) = pvVar1;
        if (*(long *)((long)hal + 0x20) == 0) {
          _mpp_log_l(2,"hal_jpege_vepu1","failed to malloc vepu2 regs\n","hal_jpege_vepu1_init");
          hal_local._4_4_ = MPP_NOK;
        }
        else {
          if ((hal_jpege_debug & 1) != 0) {
            _mpp_log_l(4,"hal_jpege_vepu1","leave hal %p\n","hal_jpege_vepu1_init",hal);
          }
          hal_local._4_4_ = MPP_OK;
        }
      }
    }
  }
  else {
    _mpp_log_l(2,"hal_jpege_vepu1","mpp_dev_init failed. ret: %d\n","hal_jpege_vepu1_init",
               (ulong)(uint)hal_local._4_4_);
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_jpege_vepu1_init(void *hal, MppEncHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;

    mpp_env_get_u32("hal_jpege_debug", &hal_jpege_debug, 0);
    hal_jpege_dbg_func("enter hal %p cfg %p\n", hal, cfg);

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_VEPU1;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        return ret;
    }
    ctx->dev = cfg->dev;

    jpege_bits_init(&ctx->bits);
    mpp_assert(ctx->bits);

    ret = hal_jpege_vepu_init_rc(&ctx->hal_rc);
    if (ret)
        return ret;

    ctx->cfg = cfg->cfg;
    ctx->reg_size = sizeof(RK_U32) * VEPU_JPEGE_VEPU1_NUM_REGS;
    ctx->regs = mpp_calloc_size(void, ctx->reg_size + EXTRA_INFO_SIZE);
    if (NULL == ctx->regs) {
        mpp_err_f("failed to malloc vepu1 regs\n");
        return MPP_NOK;
    }

    ctx->regs_out = mpp_calloc_size(void, ctx->reg_size + EXTRA_INFO_SIZE);
    if (NULL == ctx->regs_out) {
        mpp_err_f("failed to malloc vepu2 regs\n");
        return MPP_NOK;
    }

    hal_jpege_dbg_func("leave hal %p\n", hal);
    return MPP_OK;
}